

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O3

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  bool bVar6;
  ulong uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  string err;
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  bVar6 = !shouldBePositive;
  uVar12 = int64Parameter->defaultvalue_;
  lVar2 = (long)uVar12 >> 0x3f;
  cVar1 = (char)((long)uVar12 >> 0x3f);
  if (0 < (long)uVar12 || bVar6) {
    if (int64Parameter->_oneof_case_[0] == 10) {
      lVar4 = ((int64Parameter->AllowedValues_).range_)->minvalue_;
      if (0 < lVar4 || bVar6) {
        lVar11 = ((int64Parameter->AllowedValues_).range_)->maxvalue_;
        if (0 < lVar11 || bVar6) {
          if (lVar4 <= (long)uVar12 && (long)uVar12 <= lVar11) goto LAB_00311b56;
          uVar7 = -uVar12;
          if (0 < (long)uVar12) {
            uVar7 = uVar12;
          }
          uVar13 = 1;
          if (9 < uVar7) {
            uVar12 = uVar7;
            uVar3 = 4;
            do {
              uVar13 = uVar3;
              if (uVar12 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_003124a8;
              }
              if (uVar12 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_003124a8;
              }
              if (uVar12 < 10000) goto LAB_003124a8;
              bVar6 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              uVar3 = uVar13 + 4;
            } while (bVar6);
            uVar13 = uVar13 + 1;
          }
LAB_003124a8:
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - cVar1);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_b0[0] - lVar2),uVar13,uVar7);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb2ac);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_80 = *plVar8;
            lStack_78 = plVar5[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar8;
            local_90 = (long *)*plVar5;
          }
          local_88 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_60 = *plVar8;
            lStack_58 = plVar5[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar8;
            local_70 = (long *)*plVar5;
          }
          local_68 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_40 = *plVar8;
            lStack_38 = plVar5[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar8;
            local_50 = (long *)*plVar5;
          }
          local_48 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_d0.field_2._M_allocated_capacity = *psVar9;
            local_d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar9;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
        }
        else {
          uVar12 = -lVar11;
          uVar13 = 1;
          if (9 < uVar12) {
            uVar7 = uVar12;
            uVar3 = 4;
            do {
              uVar13 = uVar3;
              if (uVar7 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_0031204a;
              }
              if (uVar7 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_0031204a;
              }
              if (uVar7 < 10000) goto LAB_0031204a;
              bVar6 = 99999 < uVar7;
              uVar7 = uVar7 / 10000;
              uVar3 = uVar13 + 4;
            } while (bVar6);
            uVar13 = uVar13 + 1;
          }
LAB_0031204a:
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - (char)(lVar11 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_b0[0] - (lVar11 >> 0x3f)),uVar13,uVar12);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb326);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_80 = *plVar8;
            lStack_78 = plVar5[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar8;
            local_90 = (long *)*plVar5;
          }
          local_88 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_60 = *plVar8;
            lStack_58 = plVar5[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar8;
            local_70 = (long *)*plVar5;
          }
          local_68 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_40 = *plVar8;
            lStack_38 = plVar5[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar8;
            local_50 = (long *)*plVar5;
          }
          local_48 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_d0.field_2._M_allocated_capacity = *psVar9;
            local_d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar9;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
        }
      }
      else {
        uVar12 = -lVar4;
        uVar13 = 1;
        if (9 < uVar12) {
          uVar7 = uVar12;
          uVar3 = 4;
          do {
            uVar13 = uVar3;
            if (uVar7 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_00311e1b;
            }
            if (uVar7 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_00311e1b;
            }
            if (uVar7 < 10000) goto LAB_00311e1b;
            bVar6 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            uVar3 = uVar13 + 4;
          } while (bVar6);
          uVar13 = uVar13 + 1;
        }
LAB_00311e1b:
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - (char)(lVar4 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_b0[0] - (lVar4 >> 0x3f)),uVar13,uVar12);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb2ee);
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_80 = *plVar8;
          lStack_78 = plVar5[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar8;
          local_90 = (long *)*plVar5;
        }
        local_88 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar5[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
          local_70 = (long *)*plVar5;
        }
        local_68 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_40 = *plVar8;
          lStack_38 = plVar5[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar8;
          local_50 = (long *)*plVar5;
        }
        local_48 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d0.field_2._M_allocated_capacity = *psVar9;
          local_d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar9;
          local_d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
      }
    }
    else {
      if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_00311b56:
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      lVar4 = (long)(((int64Parameter->AllowedValues_).set_)->values_).current_size_;
      if (lVar4 != 0) {
        lVar11 = 0;
        do {
          uVar7 = *(ulong *)((long)(((int64Parameter->AllowedValues_).set_)->values_).
                                   arena_or_elements_ + lVar11);
          if (uVar7 == uVar12) goto LAB_00311b56;
          if ((long)uVar7 < 1 && !bVar6) {
            uVar12 = -uVar7;
            uVar13 = 1;
            if (uVar12 < 10) goto LAB_00312279;
            uVar10 = uVar12;
            uVar3 = 4;
            goto LAB_00311b9c;
          }
          lVar11 = lVar11 + 8;
        } while (lVar4 * 8 != lVar11);
      }
      uVar7 = -uVar12;
      if (0 < (long)uVar12) {
        uVar7 = uVar12;
      }
      uVar13 = 1;
      if (9 < uVar7) {
        uVar12 = uVar7;
        uVar3 = 4;
        do {
          uVar13 = uVar3;
          if (uVar12 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_00311bec;
          }
          if (uVar12 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_00311bec;
          }
          if (uVar12 < 10000) goto LAB_00311bec;
          bVar6 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar3 = uVar13 + 4;
        } while (bVar6);
        uVar13 = uVar13 + 1;
      }
LAB_00311bec:
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - cVar1);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_b0[0] - lVar2),uVar13,uVar7);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb2ac);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = plVar5[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar8;
        local_90 = (long *)*plVar5;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_40 = *plVar8;
        lStack_38 = plVar5[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar8;
        local_50 = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
    }
  }
  else {
    uVar12 = -uVar12;
    uVar13 = 1;
    if (9 < uVar12) {
      uVar7 = uVar12;
      uVar3 = 4;
      do {
        uVar13 = uVar3;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_00311891;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_00311891;
        }
        if (uVar7 < 10000) goto LAB_00311891;
        bVar6 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = uVar13 + 4;
      } while (bVar6);
      uVar13 = uVar13 + 1;
    }
LAB_00311891:
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - cVar1);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_b0[0] - lVar2),uVar13,uVar12);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb2b6);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_40 = *plVar8;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar8;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
  }
  goto LAB_00311ab2;
  while( true ) {
    if (uVar10 < 10000) goto LAB_00312279;
    bVar6 = uVar10 < 100000;
    uVar10 = uVar10 / 10000;
    uVar3 = uVar13 + 4;
    if (bVar6) break;
LAB_00311b9c:
    uVar13 = uVar3;
    if (uVar10 < 100) {
      uVar13 = uVar13 - 2;
      goto LAB_00312279;
    }
    if (uVar10 < 1000) {
      uVar13 = uVar13 - 1;
      goto LAB_00312279;
    }
  }
  uVar13 = uVar13 + 1;
LAB_00312279:
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar13 - (char)((long)uVar7 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_b0[0] - ((long)uVar7 >> 0x3f)),uVar13,uVar12);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3bb267);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
LAB_00311ab2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}